

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_conn.c
# Opt level: O1

void http_wr_start(nni_http_conn *conn)

{
  nni_aio *aio;
  nni_iov *local_38;
  nni_iov *iov;
  uint niov;
  
  aio = conn->wr_uaio;
  if (aio == (nni_aio *)0x0) {
    aio = (nni_aio *)nni_list_first(&conn->wrq);
    if (aio == (nni_aio *)0x0) {
      return;
    }
    nni_list_remove(&conn->wrq,aio);
    conn->wr_uaio = aio;
  }
  nni_aio_get_iov(aio,(uint *)((long)&iov + 4),&local_38);
  nni_aio_set_iov(&conn->wr_aio,iov._4_4_,local_38);
  nng_stream_send(conn->sock,&conn->wr_aio);
  return;
}

Assistant:

static void
http_wr_start(nni_http_conn *conn)
{
	nni_aio *aio;
	nni_iov *iov;
	unsigned niov;

	if ((aio = conn->wr_uaio) == NULL) {
		if ((aio = nni_list_first(&conn->wrq)) == NULL) {
			// No more stuff waiting for read.
			return;
		}
		nni_list_remove(&conn->wrq, aio);
		conn->wr_uaio = aio;
	}

	nni_aio_get_iov(aio, &niov, &iov);
	nni_aio_set_iov(&conn->wr_aio, niov, iov);
	nng_stream_send(conn->sock, &conn->wr_aio);
}